

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void printPt(ostream *out,ANNpoint p,int dim)

{
  ulong uVar1;
  
  uVar1 = 1;
  std::__ostream_insert<char,std::char_traits<char>>(out,"(",1);
  std::ostream::_M_insert<double>(*p);
  if (1 < dim) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
      std::ostream::_M_insert<double>(p[uVar1]);
      uVar1 = uVar1 + 1;
    } while ((uint)dim != uVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,")\n",2);
  return;
}

Assistant:

void printPt(ostream &out, ANNpoint p, int dim)  // print point
{
    out << "(" << p[0];
    for (int i = 1; i < dim; i++) {
        out << ", " << p[i];
    }
    out << ")\n";
}